

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quantize.cpp
# Opt level: O2

void nv::Quantize::BinaryAlpha(Image *image,int alpha_threshold)

{
  Color32 CVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar5;
  uint y;
  uint y_00;
  uint x;
  uint x_00;
  
  if (image == (Image *)0x0) {
    iVar2 = nvAbort("image != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/Quantize.cpp"
                    ,0x1e,"void nv::Quantize::BinaryAlpha(Image *, int)");
    if (iVar2 == 1) {
      raise(5);
    }
  }
  uVar3 = Image::width(image);
  uVar4 = Image::height(image);
  for (y_00 = 0; y_00 != uVar4; y_00 = y_00 + 1) {
    for (x_00 = 0; uVar3 != x_00; x_00 = x_00 + 1) {
      paVar5 = &Image::pixel(image,x_00,y_00)->field_0;
      CVar1.field_0 = (anon_union_4_2_12391d8d_for_Color32_0)paVar5->u;
      paVar5 = &Image::pixel(image,x_00,y_00)->field_0;
      *paVar5 = (anon_union_4_2_12391d8d_for_Color32_0)
                ((uint)((int)((uint)CVar1.field_0 >> 0x18) <= alpha_threshold) * 0x1000000 +
                 ((uint)CVar1.field_0 & 0xffffff) + -0x1000000);
    }
  }
  return;
}

Assistant:

void nv::Quantize::BinaryAlpha( Image * image, int alpha_threshold /*= 127*/ )
{
	nvCheck(image != NULL);
	
	const uint w = image->width();
	const uint h = image->height();
	
	for(uint y = 0; y < h; y++) {
		for(uint x = 0; x < w; x++) {
			
			Color32 pixel = image->pixel(x, y);
			
			// Convert color.
			if( pixel.a > alpha_threshold ) pixel.a = 255;
			else pixel.a = 0;
			
			// Store color.
			image->pixel(x, y) = pixel;
		}
	}
}